

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstm_x86_avx512.cpp
# Opt level: O3

int __thiscall
ncnn::LSTM_x86_avx512::forward
          (LSTM_x86_avx512 *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  Mat *bottom_blob;
  Allocator *_allocator;
  Mat *this_00;
  int *piVar1;
  uint uVar2;
  int iVar3;
  _func_int *p_Var4;
  int iVar5;
  pointer pMVar6;
  size_t sVar7;
  ulong uVar8;
  void *pvVar9;
  int _h;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *pvVar10;
  void *__dest;
  bool bVar11;
  Mat m;
  Mat local_328;
  Mat local_2d8;
  ulong local_288;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_280;
  Mat local_278;
  Mat m_2;
  Mat m_1;
  Mat m_4;
  Mat m_3;
  Mat local_108;
  Mat m_6;
  Mat m_5;
  
  bottom_blob = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
  local_288 = (ulong)(uint)bottom_blob->h;
  iVar5 = *(int *)(&this->field_0xd8 + (long)this->_vptr_LSTM_x86_avx512[-3]);
  local_2d8.cstep = 0;
  local_2d8.data = (void *)0x0;
  local_2d8.refcount._0_4_ = 0;
  local_2d8.refcount._4_4_ = 0;
  local_2d8.elemsize._0_4_ = 0;
  local_2d8.elemsize._4_4_ = 0;
  local_2d8.elempack = 0;
  local_2d8.allocator = (Allocator *)0x0;
  local_2d8.dims = 0;
  local_2d8.w = 0;
  local_2d8.h = 0;
  local_2d8.d = 0;
  local_2d8.c = 0;
  local_328.cstep = 0;
  local_328.data = (void *)0x0;
  local_328.refcount._0_4_ = 0;
  local_328.refcount._4_4_ = 0;
  local_328.elemsize._0_4_ = 0;
  local_328.elemsize._4_4_ = 0;
  local_328.elempack = 0;
  local_328.allocator = (Allocator *)0x0;
  local_328.dims = 0;
  local_328.w = 0;
  local_328.h = 0;
  local_328.d = 0;
  local_328.c = 0;
  pvVar9 = (void *)((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                          _M_impl.super__Vector_impl_data._M_finish -
                   (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                         _M_impl.super__Vector_impl_data._M_start);
  _allocator = (&opt->blob_allocator)[pvVar9 != (void *)0xd8];
  local_280 = top_blobs;
  if ((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)bottom_blob == 0xd8) {
    Mat::clone(&m,(__fn *)(bottom_blob + 1),_allocator,(int)opt,pvVar9);
    pvVar10 = local_280;
    piVar1 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    piVar1 = (int *)CONCAT44(local_2d8.refcount._4_4_,local_2d8.refcount._0_4_);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        if (local_2d8.allocator == (Allocator *)0x0) {
          if (local_2d8.data != (void *)0x0) {
            free(local_2d8.data);
          }
        }
        else {
          (*(local_2d8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar1 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
    local_2d8.data = m.data;
    local_2d8.refcount._0_4_ = m.refcount._0_4_;
    local_2d8.refcount._4_4_ = m.refcount._4_4_;
    local_2d8.elemsize._0_4_ = (undefined4)m.elemsize;
    local_2d8.elemsize._4_4_ = m.elemsize._4_4_;
    local_2d8.elempack = m.elempack;
    local_2d8.allocator = m.allocator;
    local_2d8.dims = m.dims;
    local_2d8.w = m.w;
    local_2d8.h = m.h;
    local_2d8.d = m.d;
    local_2d8.c = m.c;
    local_2d8.cstep = m.cstep;
    sVar7 = m.cstep;
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        if (m.allocator == (Allocator *)0x0) {
          if (m.data != (void *)0x0) {
            free(m.data);
          }
        }
        else {
          (*(m.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    Mat::clone(&m,(__fn *)((bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)
                           ._M_impl.super__Vector_impl_data._M_start + 2),_allocator,(int)sVar7,
               pvVar9);
    piVar1 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    piVar1 = (int *)CONCAT44(local_328.refcount._4_4_,local_328.refcount._0_4_);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        if (local_328.allocator == (Allocator *)0x0) {
          if (local_328.data != (void *)0x0) {
            free(local_328.data);
          }
        }
        else {
          (*(local_328.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar1 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
    local_328.data = m.data;
    local_328.refcount._0_4_ = m.refcount._0_4_;
    local_328.refcount._4_4_ = m.refcount._4_4_;
    local_328.elemsize._0_4_ = (undefined4)m.elemsize;
    local_328.elemsize._4_4_ = m.elemsize._4_4_;
    local_328.elempack = m.elempack;
    local_328.allocator = m.allocator;
    local_328.dims = m.dims;
    local_328.w = m.w;
    local_328.h = m.h;
    local_328.d = m.d;
    local_328.c = m.c;
    local_328.cstep = m.cstep;
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        if (m.allocator == (Allocator *)0x0) {
          if (m.data != (void *)0x0) {
            free(m.data);
          }
        }
        else {
          (*(m.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  else {
    _h = (iVar5 == 2) + 1;
    Mat::create(&local_2d8,*(int *)(&this->field_0xd0 + (long)this->_vptr_LSTM_x86_avx512[-3]),_h,4,
                _allocator);
    iVar3 = -100;
    if ((local_2d8.data == (void *)0x0) || (local_2d8.cstep * (long)local_2d8.c == 0))
    goto LAB_003926b1;
    uVar2 = (int)local_2d8.cstep * local_2d8.c;
    if (0 < (int)uVar2) {
      memset(local_2d8.data,0,(ulong)uVar2 << 2);
    }
    Mat::create(&local_328,*(int *)(&this->field_0xd0 + (long)this->_vptr_LSTM_x86_avx512[-3]),_h,4,
                _allocator);
    pvVar10 = local_280;
    if ((local_328.data == (void *)0x0) || (local_328.cstep * (long)local_328.c == 0))
    goto LAB_003926b1;
    uVar2 = (int)local_328.cstep * local_328.c;
    if (0 < (int)uVar2) {
      memset(local_328.data,0,(ulong)uVar2 << 2);
    }
  }
  this_00 = (pvVar10->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  Mat::create(this_00,*(int *)(&this->field_0xd0 + (long)this->_vptr_LSTM_x86_avx512[-3]) <<
                      (iVar5 == 2),(int)local_288,4,opt->blob_allocator);
  iVar3 = -100;
  if ((this_00->data != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
    p_Var4 = this->_vptr_LSTM_x86_avx512[-3];
    uVar2 = *(uint *)(&this->field_0xd8 + (long)p_Var4);
    if (uVar2 < 2) {
      m.w = *(int *)(&this->field_0x154 + (long)p_Var4);
      m.h = *(int *)(&this->field_0x158 + (long)p_Var4);
      m.c = *(int *)(&this->field_0x15c + (long)p_Var4);
      m.data = *(void **)(&this->field_0x128 + (long)p_Var4);
      uVar8 = *(ulong *)(&this->field_0x138 + (long)p_Var4);
      m.elempack = *(int *)(&this->field_0x140 + (long)p_Var4);
      m.allocator = *(Allocator **)(&this->field_0x148 + (long)p_Var4);
      m.refcount._0_4_ = 0;
      m.refcount._4_4_ = 0;
      m.elemsize._0_4_ = (undefined4)uVar8;
      m.elemsize._4_4_ = (undefined4)(uVar8 >> 0x20);
      m.d = 1;
      m.dims = *(int *)(&this->field_0x150 + (long)p_Var4) + -1;
      m.cstep = (uVar8 * (long)m.h * (long)m.w + 0xf & 0xfffffffffffffff0) / uVar8;
      if (*(int *)(&this->field_0x150 + (long)p_Var4) == 4) {
        m.cstep = (long)m.h * (long)m.w;
      }
      m_1.w = *(int *)(&this->field_0x19c + (long)p_Var4);
      m_1.h = *(int *)(&this->field_0x1a0 + (long)p_Var4);
      m_1.data = *(void **)(&this->field_0x170 + (long)p_Var4);
      uVar8 = *(ulong *)(&this->field_0x180 + (long)p_Var4);
      m_1.elempack = *(int *)(&this->field_0x188 + (long)p_Var4);
      m_1.allocator = *(Allocator **)(&this->field_0x190 + (long)p_Var4);
      m_1.refcount._0_4_ = 0;
      m_1.refcount._4_4_ = 0;
      m_1.elemsize._0_4_ = (undefined4)uVar8;
      m_1.elemsize._4_4_ = (undefined4)(uVar8 >> 0x20);
      m_1.c = *(int *)(&this->field_0x1a4 + (long)p_Var4);
      m_1.d = 1;
      m_1.dims = *(int *)(&this->field_0x198 + (long)p_Var4) + -1;
      m_1.cstep = (uVar8 * (long)m_1.h * (long)m_1.w + 0xf & 0xfffffffffffffff0) / uVar8;
      if (*(int *)(&this->field_0x198 + (long)p_Var4) == 4) {
        m_1.cstep = (long)m_1.h * (long)m_1.w;
      }
      m_2.w = *(int *)(&this->field_0x10c + (long)p_Var4);
      m_2.c = *(int *)(&this->field_0x114 + (long)p_Var4);
      m_2.data = *(void **)(&this->field_0xe0 + (long)p_Var4);
      m_2.elemsize = *(size_t *)(&this->field_0xf0 + (long)p_Var4);
      m_2.elempack = *(int *)(&this->field_0xf8 + (long)p_Var4);
      m_2.allocator = *(Allocator **)(&this->field_0x100 + (long)p_Var4);
      m_2.refcount = (int *)0x0;
      m_2.d = 1;
      m_2.h = *(int *)(&this->field_0x110 + (long)p_Var4);
      sVar7 = (long)*(int *)(&this->field_0x110 + (long)p_Var4) * (long)m_2.w;
      m_2.dims = *(int *)(&this->field_0x108 + (long)p_Var4) + -1;
      m_2.cstep = (m_2.elemsize * sVar7 + 0xf & 0xfffffffffffffff0) / m_2.elemsize;
      if (*(int *)(&this->field_0x108 + (long)p_Var4) == 4) {
        m_2.cstep = sVar7;
      }
      iVar3 = lstm(bottom_blob,this_00,uVar2,&m,&m_1,&m_2,&local_2d8,&local_328,
                   (Option *)opt->workspace_allocator);
      if (iVar3 != 0) goto LAB_003926b1;
      p_Var4 = this->_vptr_LSTM_x86_avx512[-3];
      uVar2 = *(uint *)(&this->field_0xd8 + (long)p_Var4);
    }
    if (uVar2 == 2) {
      m.cstep = 0;
      m.data = (void *)0x0;
      m.refcount._0_4_ = 0;
      m.refcount._4_4_ = 0;
      m.elemsize._0_4_ = 0;
      m.elemsize._4_4_ = 0;
      m.elempack = 0;
      m.allocator = (Allocator *)0x0;
      m.dims = 0;
      m.w = 0;
      m.h = 0;
      m.d = 0;
      m.c = 0;
      iVar5 = (int)local_288;
      Mat::create(&m,*(int *)(&this->field_0xd0 + (long)p_Var4),iVar5,4,opt->workspace_allocator);
      iVar3 = -100;
      if ((m.data == (void *)0x0) || ((long)m.c * m.cstep == 0)) {
        bVar11 = false;
      }
      else {
        m_1.cstep = 0;
        m_1.data = (void *)0x0;
        m_1.refcount._0_4_ = 0;
        m_1.refcount._4_4_ = 0;
        m_1.elemsize._0_4_ = 0;
        m_1.elemsize._4_4_ = 0;
        m_1.elempack = 0;
        m_1.allocator = (Allocator *)0x0;
        m_1.dims = 0;
        m_1.w = 0;
        m_1.h = 0;
        m_1.d = 0;
        m_1.c = 0;
        Mat::create(&m_1,*(int *)(&this->field_0xd0 + (long)this->_vptr_LSTM_x86_avx512[-3]),iVar5,4
                    ,opt->workspace_allocator);
        iVar3 = -100;
        if ((m_1.data == (void *)0x0) || ((long)m_1.c * m_1.cstep == 0)) {
          bVar11 = false;
        }
        else {
          m_2.cstep = (size_t)local_2d8.w;
          m_2.elemsize = CONCAT44(local_2d8.elemsize._4_4_,(undefined4)local_2d8.elemsize);
          m_2.data = local_2d8.data;
          m_2.refcount = (int *)0x0;
          m_2.elempack = local_2d8.elempack;
          m_2.allocator = local_2d8.allocator;
          m_2.dims = 2;
          m_2.w = local_2d8.w;
          m_2.h = 1;
          m_2.d = 1;
          m_2.c = 1;
          local_108.cstep = (size_t)local_328.w;
          local_108.elemsize = CONCAT44(local_328.elemsize._4_4_,(undefined4)local_328.elemsize);
          local_108.data = local_328.data;
          local_108.refcount = (int *)0x0;
          local_108.elempack = local_328.elempack;
          local_108.allocator = local_328.allocator;
          local_108.dims = 2;
          local_108.w = local_328.w;
          local_108.h = 1;
          local_108.d = 1;
          local_108.c = 1;
          p_Var4 = this->_vptr_LSTM_x86_avx512[-3];
          local_278.w = *(int *)(&this->field_0x154 + (long)p_Var4);
          local_278.c = *(int *)(&this->field_0x15c + (long)p_Var4);
          local_278.data = *(void **)(&this->field_0x128 + (long)p_Var4);
          local_278.elemsize = *(size_t *)(&this->field_0x138 + (long)p_Var4);
          local_278.elempack = *(int *)(&this->field_0x140 + (long)p_Var4);
          local_278.allocator = *(Allocator **)(&this->field_0x148 + (long)p_Var4);
          local_278.refcount = (int *)0x0;
          local_278.d = 1;
          local_278.h = *(int *)(&this->field_0x158 + (long)p_Var4);
          uVar8 = (long)*(int *)(&this->field_0x158 + (long)p_Var4) * (long)local_278.w;
          local_278.dims = *(int *)(&this->field_0x150 + (long)p_Var4) + -1;
          local_278.cstep =
               (local_278.elemsize * uVar8 + 0xf & 0xfffffffffffffff0) / local_278.elemsize;
          if (*(int *)(&this->field_0x150 + (long)p_Var4) == 4) {
            local_278.cstep = uVar8;
          }
          m_3.w = *(int *)(&this->field_0x19c + (long)p_Var4);
          m_3.c = *(int *)(&this->field_0x1a4 + (long)p_Var4);
          m_3.data = *(void **)(&this->field_0x170 + (long)p_Var4);
          m_3.elemsize = *(size_t *)(&this->field_0x180 + (long)p_Var4);
          m_3.elempack = *(int *)(&this->field_0x188 + (long)p_Var4);
          m_3.allocator = *(Allocator **)(&this->field_0x190 + (long)p_Var4);
          m_3.refcount = (int *)0x0;
          m_3.d = 1;
          m_3.h = *(int *)(&this->field_0x1a0 + (long)p_Var4);
          sVar7 = (long)*(int *)(&this->field_0x1a0 + (long)p_Var4) * (long)m_3.w;
          m_3.dims = *(int *)(&this->field_0x198 + (long)p_Var4) + -1;
          m_3.cstep = (m_3.elemsize * sVar7 + 0xf & 0xfffffffffffffff0) / m_3.elemsize;
          if (*(int *)(&this->field_0x198 + (long)p_Var4) == 4) {
            m_3.cstep = sVar7;
          }
          m_4.w = *(int *)(&this->field_0x10c + (long)p_Var4);
          m_4.h = *(int *)(&this->field_0x110 + (long)p_Var4);
          m_4.c = *(int *)(&this->field_0x114 + (long)p_Var4);
          m_4.data = *(void **)(&this->field_0xe0 + (long)p_Var4);
          m_4.elemsize = *(size_t *)(&this->field_0xf0 + (long)p_Var4);
          m_4.elempack = *(int *)(&this->field_0xf8 + (long)p_Var4);
          m_4.allocator = *(Allocator **)(&this->field_0x100 + (long)p_Var4);
          m_4.refcount = (int *)0x0;
          m_4.d = 1;
          m_4.dims = *(int *)(&this->field_0x108 + (long)p_Var4) + -1;
          m_4.cstep = (m_4.elemsize * (long)m_4.h * (long)m_4.w + 0xf & 0xfffffffffffffff0) /
                      m_4.elemsize;
          if (*(int *)(&this->field_0x108 + (long)p_Var4) == 4) {
            m_4.cstep = (long)m_4.h * (long)m_4.w;
          }
          iVar3 = lstm(bottom_blob,&m,0,&local_278,&m_3,&m_4,&m_2,&local_108,
                       (Option *)opt->workspace_allocator);
          uVar8 = local_288;
          if (iVar3 == 0) {
            local_278.cstep = (size_t)local_2d8.w;
            local_278.elemsize = CONCAT44(local_2d8.elemsize._4_4_,(undefined4)local_2d8.elemsize);
            local_278.data = (void *)(local_278.elemsize * local_278.cstep + (long)local_2d8.data);
            local_278.refcount = (int *)0x0;
            local_278.elempack = local_2d8.elempack;
            local_278.allocator = local_2d8.allocator;
            local_278.dims = 2;
            local_278.w = local_2d8.w;
            local_278.h = 1;
            local_278.d = 1;
            local_278.c = 1;
            m_3.cstep = (size_t)local_328.w;
            m_3.elemsize = CONCAT44(local_328.elemsize._4_4_,(undefined4)local_328.elemsize);
            m_3.data = (void *)(m_3.elemsize * m_3.cstep + (long)local_328.data);
            m_3.refcount = (int *)0x0;
            m_3.elempack = local_328.elempack;
            m_3.allocator = local_328.allocator;
            m_3.dims = 2;
            m_3.w = local_328.w;
            m_3.h = 1;
            m_3.d = 1;
            m_3.c = 1;
            p_Var4 = this->_vptr_LSTM_x86_avx512[-3];
            m_4.w = *(int *)(&this->field_0x154 + (long)p_Var4);
            m_4.h = *(int *)(&this->field_0x158 + (long)p_Var4);
            m_4.c = *(int *)(&this->field_0x15c + (long)p_Var4);
            m_4.elemsize = *(size_t *)(&this->field_0x138 + (long)p_Var4);
            m_4.data = (void *)(*(long *)(&this->field_0x168 + (long)p_Var4) * m_4.elemsize +
                               *(long *)(&this->field_0x128 + (long)p_Var4));
            m_4.elempack = *(int *)(&this->field_0x140 + (long)p_Var4);
            m_4.allocator = *(Allocator **)(&this->field_0x148 + (long)p_Var4);
            m_4.refcount = (int *)0x0;
            m_4.d = 1;
            m_4.dims = *(int *)(&this->field_0x150 + (long)p_Var4) + -1;
            m_4.cstep = (m_4.elemsize * (long)m_4.h * (long)m_4.w + 0xf & 0xfffffffffffffff0) /
                        m_4.elemsize;
            if (*(int *)(&this->field_0x150 + (long)p_Var4) == 4) {
              m_4.cstep = (long)m_4.h * (long)m_4.w;
            }
            m_5.w = *(int *)(&this->field_0x19c + (long)p_Var4);
            m_5.h = *(int *)(&this->field_0x1a0 + (long)p_Var4);
            m_5.c = *(int *)(&this->field_0x1a4 + (long)p_Var4);
            m_5.elemsize = *(size_t *)(&this->field_0x180 + (long)p_Var4);
            m_5.data = (void *)(*(long *)(&this->field_0x1b0 + (long)p_Var4) * m_5.elemsize +
                               *(long *)(&this->field_0x170 + (long)p_Var4));
            m_5.elempack = *(int *)(&this->field_0x188 + (long)p_Var4);
            m_5.allocator = *(Allocator **)(&this->field_0x190 + (long)p_Var4);
            m_5.refcount = (int *)0x0;
            m_5.d = 1;
            m_5.dims = *(int *)(&this->field_0x198 + (long)p_Var4) + -1;
            m_5.cstep = (m_5.elemsize * (long)m_5.h * (long)m_5.w + 0xf & 0xfffffffffffffff0) /
                        m_5.elemsize;
            if (*(int *)(&this->field_0x198 + (long)p_Var4) == 4) {
              m_5.cstep = (long)m_5.h * (long)m_5.w;
            }
            m_6.w = *(int *)(&this->field_0x10c + (long)p_Var4);
            m_6.h = *(int *)(&this->field_0x110 + (long)p_Var4);
            m_6.c = *(int *)(&this->field_0x114 + (long)p_Var4);
            m_6.elemsize = *(size_t *)(&this->field_0xf0 + (long)p_Var4);
            m_6.data = (void *)(*(long *)(&this->field_0x120 + (long)p_Var4) * m_6.elemsize +
                               *(long *)(&this->field_0xe0 + (long)p_Var4));
            m_6.elempack = *(int *)(&this->field_0xf8 + (long)p_Var4);
            m_6.allocator = *(Allocator **)(&this->field_0x100 + (long)p_Var4);
            m_6.refcount = (int *)0x0;
            m_6.d = 1;
            m_6.dims = *(int *)(&this->field_0x108 + (long)p_Var4) + -1;
            m_6.cstep = (m_6.elemsize * (long)m_6.h * (long)m_6.w + 0xf & 0xfffffffffffffff0) /
                        m_6.elemsize;
            if (*(int *)(&this->field_0x108 + (long)p_Var4) == 4) {
              m_6.cstep = (long)m_6.h * (long)m_6.w;
            }
            iVar3 = lstm(bottom_blob,&m_1,1,&m_4,&m_5,&m_6,&local_278,&m_3,
                         (Option *)opt->workspace_allocator);
            bVar11 = iVar3 == 0;
            if (bVar11) {
              if ((int)uVar8 < 1) {
                iVar3 = 0;
              }
              else {
                iVar3 = 0;
                uVar8 = 0;
                do {
                  pvVar9 = (void *)((long)m_1.w * uVar8 *
                                    CONCAT44(m_1.elemsize._4_4_,(undefined4)m_1.elemsize) +
                                   (long)m_1.data);
                  __dest = (void *)((long)this_00->w * uVar8 * this_00->elemsize +
                                   (long)this_00->data);
                  memcpy(__dest,(void *)((long)m.w * uVar8 *
                                         CONCAT44(m.elemsize._4_4_,(undefined4)m.elemsize) +
                                        (long)m.data),
                         (long)*(int *)(&this->field_0xd0 + (long)this->_vptr_LSTM_x86_avx512[-3])
                         << 2);
                  memcpy((void *)((long)*(int *)(&this->field_0xd0 +
                                                (long)this->_vptr_LSTM_x86_avx512[-3]) * 4 +
                                 (long)__dest),pvVar9,
                         (long)*(int *)(&this->field_0xd0 + (long)this->_vptr_LSTM_x86_avx512[-3])
                         << 2);
                  uVar8 = uVar8 + 1;
                  pvVar10 = local_280;
                } while (local_288 != uVar8);
              }
            }
            if (local_278.refcount != (int *)0x0) {
              LOCK();
              *local_278.refcount = *local_278.refcount + -1;
              UNLOCK();
              if (*local_278.refcount == 0) {
                if (local_278.allocator == (Allocator *)0x0) {
                  if (local_278.data != (void *)0x0) {
                    free(local_278.data);
                  }
                }
                else {
                  (*(local_278.allocator)->_vptr_Allocator[3])();
                }
              }
            }
            if (local_108.refcount != (int *)0x0) {
              LOCK();
              *local_108.refcount = *local_108.refcount + -1;
              UNLOCK();
              if (*local_108.refcount == 0) {
                if (local_108.allocator == (Allocator *)0x0) {
                  if (local_108.data != (void *)0x0) {
                    free(local_108.data);
                  }
                }
                else {
                  (*(local_108.allocator)->_vptr_Allocator[3])();
                }
              }
            }
          }
          else {
            bVar11 = false;
          }
          if (m_2.refcount != (int *)0x0) {
            LOCK();
            *m_2.refcount = *m_2.refcount + -1;
            UNLOCK();
            if (*m_2.refcount == 0) {
              if (m_2.allocator == (Allocator *)0x0) {
                if (m_2.data != (void *)0x0) {
                  free(m_2.data);
                }
              }
              else {
                (*(m_2.allocator)->_vptr_Allocator[3])();
              }
            }
          }
        }
        piVar1 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (*piVar1 == 0) {
            if (m_1.allocator == (Allocator *)0x0) {
              if (m_1.data != (void *)0x0) {
                free(m_1.data);
              }
            }
            else {
              (*(m_1.allocator)->_vptr_Allocator[3])();
            }
          }
        }
      }
      piVar1 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          if (m.allocator == (Allocator *)0x0) {
            if (m.data != (void *)0x0) {
              free(m.data);
            }
          }
          else {
            (*(m.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      if (!bVar11) goto LAB_003926b1;
    }
    pMVar6 = (pvVar10->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    iVar3 = 0;
    if ((long)(pvVar10->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_finish - (long)pMVar6 == 0xd8) {
      if (pMVar6 + 1 != &local_2d8) {
        piVar1 = (int *)CONCAT44(local_2d8.refcount._4_4_,local_2d8.refcount._0_4_);
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + 1;
          UNLOCK();
        }
        piVar1 = pMVar6[1].refcount;
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (*piVar1 == 0) {
            if (pMVar6[1].allocator == (Allocator *)0x0) {
              if (pMVar6[1].data != (void *)0x0) {
                free(pMVar6[1].data);
              }
            }
            else {
              (*(pMVar6[1].allocator)->_vptr_Allocator[3])();
            }
          }
        }
        pMVar6[1].data = local_2d8.data;
        pMVar6[1].refcount = (int *)CONCAT44(local_2d8.refcount._4_4_,local_2d8.refcount._0_4_);
        pMVar6[1].elemsize = CONCAT44(local_2d8.elemsize._4_4_,(undefined4)local_2d8.elemsize);
        pMVar6[1].elempack = local_2d8.elempack;
        pMVar6[1].allocator = local_2d8.allocator;
        pMVar6[1].dims = local_2d8.dims;
        pMVar6[1].w = local_2d8.w;
        pMVar6[1].h = local_2d8.h;
        pMVar6[1].d = local_2d8.d;
        pMVar6[1].c = local_2d8.c;
        pMVar6[1].cstep = local_2d8.cstep;
        pMVar6 = (pvVar10->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
      }
      iVar3 = 0;
      if (pMVar6 + 2 != &local_328) {
        piVar1 = (int *)CONCAT44(local_328.refcount._4_4_,local_328.refcount._0_4_);
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + 1;
          UNLOCK();
        }
        piVar1 = pMVar6[2].refcount;
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (*piVar1 == 0) {
            if (pMVar6[2].allocator == (Allocator *)0x0) {
              if (pMVar6[2].data != (void *)0x0) {
                free(pMVar6[2].data);
              }
            }
            else {
              (*(pMVar6[2].allocator)->_vptr_Allocator[3])();
            }
          }
        }
        pMVar6[2].data = local_328.data;
        pMVar6[2].refcount = (int *)CONCAT44(local_328.refcount._4_4_,local_328.refcount._0_4_);
        pMVar6[2].elemsize = CONCAT44(local_328.elemsize._4_4_,(undefined4)local_328.elemsize);
        pMVar6[2].elempack = local_328.elempack;
        pMVar6[2].allocator = local_328.allocator;
        pMVar6[2].dims = local_328.dims;
        pMVar6[2].w = local_328.w;
        pMVar6[2].h = local_328.h;
        pMVar6[2].d = local_328.d;
        pMVar6[2].c = local_328.c;
        pMVar6[2].cstep = local_328.cstep;
      }
    }
  }
LAB_003926b1:
  piVar1 = (int *)CONCAT44(local_328.refcount._4_4_,local_328.refcount._0_4_);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      if (local_328.allocator == (Allocator *)0x0) {
        if (local_328.data != (void *)0x0) {
          free(local_328.data);
        }
      }
      else {
        (*(local_328.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  piVar1 = (int *)CONCAT44(local_2d8.refcount._4_4_,local_2d8.refcount._0_4_);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      if (local_2d8.allocator == (Allocator *)0x0) {
        if (local_2d8.data != (void *)0x0) {
          free(local_2d8.data);
        }
      }
      else {
        (*(local_2d8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar3;
}

Assistant:

int LSTM_x86_avx512::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
#if __AVX__
    const Mat& bottom_blob = bottom_blobs[0];
    int T = bottom_blob.h;
    int num_directions = direction == 2 ? 2 : 1;

    Mat hidden;
    Mat cell;
    Allocator* hidden_cell_allocator = top_blobs.size() == 3 ? opt.blob_allocator : opt.workspace_allocator;
    if (bottom_blobs.size() == 3)
    {
        hidden = bottom_blobs[1].clone(hidden_cell_allocator);
        cell = bottom_blobs[2].clone(hidden_cell_allocator);
    }
    else
    {
        hidden.create(num_output, num_directions, 4u, hidden_cell_allocator);
        if (hidden.empty())
            return -100;
        hidden.fill(0.f);

        cell.create(num_output, num_directions, 4u, hidden_cell_allocator);
        if (cell.empty())
            return -100;
        cell.fill(0.f);
    }

    Mat& top_blob = top_blobs[0];
    top_blob.create(num_output * num_directions, T, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // Uni directional
    if (direction == 0 || direction == 1)
    {
        int ret = lstm(bottom_blob, top_blob, direction, weight_xc_data.channel(0), bias_c_data.channel(0), weight_hc_data.channel(0), hidden, cell, opt);
        if (ret != 0)
            return ret;
    }

    if (direction == 2)
    {
        Mat top_blob_forward(num_output, T, 4u, opt.workspace_allocator);
        if (top_blob_forward.empty())
            return -100;

        Mat top_blob_reverse(num_output, T, 4u, opt.workspace_allocator);
        if (top_blob_reverse.empty())
            return -100;

        Mat hidden0 = hidden.row_range(0, 1);
        Mat cell0 = cell.row_range(0, 1);

        int ret0 = lstm(bottom_blob, top_blob_forward, 0, weight_xc_data.channel(0), bias_c_data.channel(0), weight_hc_data.channel(0), hidden0, cell0, opt);
        if (ret0 != 0)
            return ret0;

        Mat hidden1 = hidden.row_range(1, 1);
        Mat cell1 = cell.row_range(1, 1);

        int ret1 = lstm(bottom_blob, top_blob_reverse, 1, weight_xc_data.channel(1), bias_c_data.channel(1), weight_hc_data.channel(1), hidden1, cell1, opt);
        if (ret1 != 0)
            return ret1;

        // concat w
        for (int i = 0; i < T; i++)
        {
            const float* pf = top_blob_forward.row(i);
            const float* pr = top_blob_reverse.row(i);
            float* ptr = top_blob.row(i);

            memcpy(ptr, pf, num_output * sizeof(float));
            memcpy(ptr + num_output, pr, num_output * sizeof(float));
        }
    }

    if (top_blobs.size() == 3)
    {
        top_blobs[1] = hidden;
        top_blobs[2] = cell;
    }

    return 0;
#else
    return LSTM::forward(bottom_blobs, top_blobs, opt);
#endif
}